

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::anon_unknown_5::ValidateTargetConstraints
          (anon_unknown_5 *this,Message *options,DescriptorPool *pool,
          ErrorCollector *error_collector,string_view file_name,OptionTargetType target_type)

{
  DescriptorPool *m;
  bool bVar1;
  Descriptor *type;
  MessageLite *pMVar2;
  char *pcVar3;
  OptionTargetType target_type_00;
  string_view sVar4;
  string_view data;
  string_view file_name_00;
  string serialized;
  DynamicMessageFactory factory;
  string local_b8;
  DescriptorPool *local_98;
  LogMessageFatal local_90;
  LogMessageFatal local_80;
  DynamicMessageFactory local_70;
  
  target_type_00 = (OptionTargetType)file_name._M_str;
  pcVar3 = (char *)((ulong)file_name._M_str & 0xffffffff);
  sVar4 = MessageLite::GetTypeName((MessageLite *)this);
  type = DescriptorPool::FindMessageTypeByName((DescriptorPool *)options,sVar4);
  if (type == (Descriptor *)0x0) {
    sVar4._M_str = pcVar3;
    sVar4._M_len = file_name._M_len;
    bVar1 = ValidateTargetConstraintsRecursive
                      (this,(Message *)pool,error_collector,sVar4,target_type_00);
    return bVar1;
  }
  local_98 = pool;
  DynamicMessageFactory::DynamicMessageFactory(&local_70);
  pMVar2 = &DynamicMessageFactory::GetPrototype(&local_70,type)->super_MessageLite;
  pMVar2 = MessageLite::New(pMVar2,(Arena *)0x0);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  bVar1 = MessageLite::SerializeToString((MessageLite *)this,&local_b8);
  m = local_98;
  if (!bVar1) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&local_80,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc"
               ,0x463,"options.SerializeToString(&serialized)");
    if (!bVar1) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_80);
    }
  }
  data._M_str = local_b8._M_dataplus._M_p;
  data._M_len = local_b8._M_string_length;
  bVar1 = MessageLite::ParseFromString(pMVar2,data);
  if (!bVar1) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&local_90,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc"
               ,0x464,"dynamic_message->ParseFromString(serialized)");
    if (!bVar1) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_90);
    }
  }
  file_name_00._M_str = pcVar3;
  file_name_00._M_len = file_name._M_len;
  bVar1 = ValidateTargetConstraintsRecursive
                    ((anon_unknown_5 *)pMVar2,(Message *)m,error_collector,file_name_00,
                     target_type_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                             local_b8.field_2._M_local_buf[0]) + 1);
  }
  (*pMVar2->_vptr_MessageLite[1])(pMVar2);
  DynamicMessageFactory::~DynamicMessageFactory(&local_70);
  return bVar1;
}

Assistant:

bool ValidateTargetConstraints(const Message& options,
                               const DescriptorPool& pool,
                               DescriptorPool::ErrorCollector& error_collector,
                               absl::string_view file_name,
                               FieldOptions::OptionTargetType target_type) {
  const Descriptor* descriptor =
      pool.FindMessageTypeByName(options.GetTypeName());
  if (descriptor == nullptr) {
    // We were unable to find the options message in the descriptor pool. This
    // implies that the proto files we are working with do not depend on
    // descriptor.proto, in which case there are no custom options to worry
    // about. We can therefore skip the use of DynamicMessage.
    return ValidateTargetConstraintsRecursive(options, error_collector,
                                              file_name, target_type);
  } else {
    DynamicMessageFactory factory;
    std::unique_ptr<Message> dynamic_message(
        factory.GetPrototype(descriptor)->New());
    std::string serialized;
    ABSL_CHECK(options.SerializeToString(&serialized));
    ABSL_CHECK(dynamic_message->ParseFromString(serialized));
    return ValidateTargetConstraintsRecursive(*dynamic_message, error_collector,
                                              file_name, target_type);
  }
}